

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O3

ggml_tensor * __thiscall test_set::build_graph(test_set *this,ggml_context *ctx)

{
  int iVar1;
  long lVar2;
  long lVar3;
  ggml_tensor *pgVar4;
  long lVar5;
  long lVar6;
  array<long,_4UL> ne_dst;
  undefined8 local_48;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 local_38;
  undefined4 uStack_34;
  undefined4 uStack_30;
  undefined4 uStack_2c;
  
  lVar2 = ggml_new_tensor(ctx,this->type_src,4);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,lVar2);
  ggml_set_name(lVar2,"src");
  local_38 = (int)(this->ne)._M_elems[2];
  uStack_34 = *(undefined4 *)((long)(this->ne)._M_elems + 0x14);
  uStack_30 = (int)(this->ne)._M_elems[3];
  uStack_2c = *(undefined4 *)((long)(this->ne)._M_elems + 0x1c);
  local_48._0_4_ = (int)(this->ne)._M_elems[0];
  local_48._4_4_ = *(undefined4 *)((long)(this->ne)._M_elems + 4);
  uStack_40 = (int)(this->ne)._M_elems[1];
  uStack_3c = *(undefined4 *)((long)(this->ne)._M_elems + 0xc);
  iVar1 = this->dim;
  if (0 < (long)iVar1) {
    lVar5 = 0;
    do {
      (&local_48)[lVar5] = (&local_48)[lVar5] << 1;
      lVar5 = lVar5 + 1;
    } while (iVar1 != lVar5);
  }
  lVar5 = ggml_new_tensor(ctx,this->type_dst,4,&local_48);
  test_case::add_sentinel(&this->super_test_case,ctx);
  ggml_set_param(ctx,lVar5);
  ggml_set_name(lVar5,"dst");
  if ((long)this->dim < 1) {
    lVar3 = 0;
  }
  else {
    lVar6 = 0;
    lVar3 = 0;
    do {
      lVar3 = lVar3 + (((&local_48)[lVar6] - (this->ne)._M_elems[lVar6]) / 2) *
                      *(long *)(lVar5 + 0x30 + lVar6 * 8);
      lVar6 = lVar6 + 1;
    } while (this->dim != lVar6);
  }
  pgVar4 = (ggml_tensor *)
           ggml_set(ctx,lVar5,lVar2,*(undefined8 *)(lVar2 + 0x38),*(undefined8 *)(lVar2 + 0x40),
                    *(undefined8 *)(lVar2 + 0x48),lVar3);
  ggml_set_name(pgVar4,"out");
  return pgVar4;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * src = ggml_new_tensor(ctx, type_src, 4, ne.data());
        ggml_set_param(ctx, src);
        ggml_set_name(src, "src");

        auto ne_dst = ne;
        for (int i = 0; i < dim; ++i) {
            ne_dst[i] *= 2;
        }
        ggml_tensor* dst = ggml_new_tensor(ctx, type_dst, 4, ne_dst.data());
        ggml_set_param(ctx, dst);
        ggml_set_name(dst, "dst");

        size_t offset = 0;
        for (int i = 0; i < dim; ++i) {
            offset += ((ne_dst[i] - ne[i])/2)*dst->nb[i];
        }
        ggml_tensor * out = ggml_set(ctx, dst, src,
            // The backward pass requires setting a contiguous region:
            src->nb[1], src->nb[2], src->nb[3], offset);
        ggml_set_name(out, "out");

        return out;
    }